

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O0

bool __thiscall llbuild::basic::FileChecksumHasher::readAndDigest(FileChecksumHasher *this)

{
  char *__filename;
  FILE *pFVar1;
  size_t sVar2;
  size_t bytesRead;
  uint8_t buffer [16384];
  FileChecksumHasher *this_local;
  
  buffer._16376_8_ = this;
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"rb");
  this->file = (FILE *)pFVar1;
  if (this->file == (FILE *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    while (sVar2 = fread(&bytesRead,1,0x4000,(FILE *)this->file), sVar2 != 0) {
      (*this->_vptr_FileChecksumHasher[3])(this,&bytesRead,sVar2);
    }
    fclose((FILE *)this->file);
    (*this->_vptr_FileChecksumHasher[2])();
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool readAndDigest() {
    this->file = std::fopen(path.c_str(), "rb");

    uint8_t buffer[4*4096];
    size_t bytesRead = 0;

    if (file != NULL) {
      while ((bytesRead = fread(buffer, 1, sizeof(buffer), file)) > 0) {
        update(buffer, bytesRead);
      }
      fclose(file);
      finalize();
      return true;
    } else {
      return false;
    }
  }